

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall mp::QuadTerms::QuadTerms(QuadTerms *this)

{
  (this->folded_).
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity =
       8;
  (this->folded_).
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->folded_).
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.m_storage;
  (this->folded_).
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0;
  (this->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (this->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
  ;
  (this->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (this->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (this->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  (this->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  (this->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (this->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  (this->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR void set_size     (size_ty size)     noexcept { m_size     = size;     }